

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O0

void synthetic_reset(stagewise_poly *poly,example *ec)

{
  size_t sVar1;
  features *in_RSI;
  long in_RDI;
  undefined7 in_stack_ffffffffffffffe8;
  
  memcpy((void *)(in_RDI + 0x6888),&in_RSI[0x100].indicies._end,0x28);
  *(undefined4 *)(in_RDI + 0x68d0) = *(undefined4 *)&in_RSI[0x101].values._end;
  *(float **)(in_RDI + 0x68d8) = in_RSI[0x101].values.end_array;
  *(size_t *)(in_RDI + 0x68e0) = in_RSI[0x101].values.erase_count;
  *(unsigned_long **)(in_RDI + 0x68e8) = in_RSI[0x101].indicies._begin;
  *(unsigned_long **)(in_RDI + 0x68f0) = in_RSI[0x101].indicies._end;
  *(unsigned_long **)(in_RDI + 0x68f8) = in_RSI[0x101].indicies.end_array;
  *(unsigned_long **)(in_RDI + 0x6880) = in_RSI[0x100].indicies._begin;
  *(byte *)(in_RDI + 0x6928) = *(byte *)&in_RSI[0x101].sum_feat_sq & 1;
  *(byte *)(in_RDI + 0x6929) = *(byte *)((long)&in_RSI[0x101].sum_feat_sq + 1) & 1;
  *(byte *)(in_RDI + 0x692a) = *(byte *)((long)&in_RSI[0x101].sum_feat_sq + 2) & 1;
  *(byte *)(in_RDI + 0x692b) = *(byte *)((long)&in_RSI[0x101].sum_feat_sq + 3) & 1;
  features::clear(in_RSI);
  *(undefined8 *)(in_RDI + 0x6900) = 0;
  *(undefined4 *)(in_RDI + 0x6914) = 0;
  sVar1 = v_array<unsigned_char>::size((v_array<unsigned_char> *)(in_RDI + 0x60));
  if (sVar1 == 0) {
    v_array<unsigned_char>::push_back
              ((v_array<unsigned_char> *)in_RSI,(uchar *)CONCAT17(0x86,in_stack_ffffffffffffffe8));
  }
  return;
}

Assistant:

void synthetic_reset(stagewise_poly &poly, example &ec)
{
  poly.synth_ec.l = ec.l;
  poly.synth_ec.weight = ec.weight;
  poly.synth_ec.tag = ec.tag;
  poly.synth_ec.example_counter = ec.example_counter;

  /**
   * Some comments on ft_offset.
   *
   * The plan is to do the feature mapping dfs with weight indices ignoring
   * the ft_offset.  This is because ft_offset is then added at the end,
   * guaranteeing local/strided access on synth_ec.  This might not matter
   * too much in this implementation (where, e.g., --oaa runs one after the
   * other, not interleaved), but who knows.
   *
   * (The other choice is to basically ignore adjusting for ft_offset when
   * doing the traversal, which means synth_ec.ft_offset is 0 here...)
   *
   * Anyway, so here is how ft_offset matters:
   *   - synthetic_create_rec must "normalize it out" of the fed weight value
   *   - parent and min_depths set/get are adjusted for it.
   *   - cycle set/get are not adjusted for it, since it doesn't matter for them.
   *   - operations on the whole weight vector (sorting, save_load, all_reduce)
   *     ignore ft_offset, just treat the thing as a flat vector.
   **/
  poly.synth_ec.ft_offset = ec.ft_offset;

  poly.synth_ec.test_only = ec.test_only;
  poly.synth_ec.end_pass = ec.end_pass;
  poly.synth_ec.sorted = ec.sorted;
  poly.synth_ec.in_use = ec.in_use;

  poly.synth_ec.feature_space[tree_atomics].clear();
  poly.synth_ec.num_features = 0;
  poly.synth_ec.total_sum_feat_sq = 0;

  if (poly.synth_ec.indices.size() == 0)
    poly.synth_ec.indices.push_back(tree_atomics);
}